

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall mkvparser::Tracks::Parse(Tracks *this)

{
  long stop;
  long lVar1;
  bool bVar2;
  long lVar3;
  Track **ppTVar4;
  long lVar5;
  long unaff_RBX;
  uint uVar6;
  longlong pos;
  longlong size;
  longlong id;
  long local_58;
  Tracks *local_50;
  long local_48;
  long local_40;
  IMkvReader *local_38;
  
  if (this->m_trackEntries != (Track **)0x0) {
    __assert_fail("m_trackEntries == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1619,"long mkvparser::Tracks::Parse()");
  }
  if (this->m_trackEntriesEnd != (Track **)0x0) {
    __assert_fail("m_trackEntriesEnd == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x161a,"long mkvparser::Tracks::Parse()");
  }
  local_58 = this->m_start;
  stop = this->m_size + local_58;
  local_38 = this->m_pSegment->m_pReader;
  uVar6 = 0;
  local_50 = this;
  if (0 < this->m_size) {
    do {
      lVar3 = ParseElementHeader(local_38,&local_58,stop,&local_40,&local_48);
      if (lVar3 < 0) {
        bVar2 = true;
        unaff_RBX = lVar3;
      }
      else if (local_48 == 0) {
        bVar2 = false;
      }
      else {
        uVar6 = uVar6 + (local_40 == 0xae);
        local_58 = local_48 + local_58;
        bVar2 = stop < local_58;
        if (stop < local_58) {
          unaff_RBX = -2;
        }
      }
      if (bVar2) {
        return unaff_RBX;
      }
    } while (local_58 < stop);
  }
  lVar3 = -2;
  if (local_58 == stop) {
    if ((int)uVar6 < 1) {
      lVar3 = 0;
    }
    else {
      ppTVar4 = (Track **)operator_new__((ulong)uVar6 << 3,(nothrow_t *)&std::nothrow);
      local_50->m_trackEntries = ppTVar4;
      if (ppTVar4 == (Track **)0x0) {
        lVar3 = -1;
      }
      else {
        local_50->m_trackEntriesEnd = ppTVar4;
        lVar5 = local_50->m_start;
        do {
          if (stop <= lVar5) {
            return (ulong)(lVar5 == stop) * 2 + -2;
          }
          local_58 = lVar5;
          lVar3 = ParseElementHeader(local_38,&local_58,stop,&local_40,&local_48);
          bVar2 = true;
          if (-1 < lVar3) {
            lVar3 = unaff_RBX;
            if (local_48 == 0) {
              bVar2 = false;
            }
            else {
              lVar1 = local_58 + local_48;
              if (stop < lVar1) {
                __assert_fail("payload_stop <= stop",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                              ,0x1653,"long mkvparser::Tracks::Parse()");
              }
              if (local_40 == 0xae) {
                ppTVar4 = local_50->m_trackEntriesEnd;
                *ppTVar4 = (Track *)0x0;
                lVar5 = ParseTrackEntry(local_50,local_58,local_48,lVar5,lVar1 - lVar5,ppTVar4);
                lVar3 = lVar5;
                if ((lVar5 == 0) && (lVar3 = unaff_RBX, *ppTVar4 != (Track *)0x0)) {
                  local_50->m_trackEntriesEnd = local_50->m_trackEntriesEnd + 1;
                }
                if (lVar5 != 0) goto LAB_001250a3;
              }
              bVar2 = false;
              local_58 = lVar1;
            }
          }
LAB_001250a3:
          lVar5 = local_58;
          unaff_RBX = lVar3;
        } while (!bVar2);
      }
    }
  }
  return lVar3;
}

Assistant:

long Tracks::Parse() {
  assert(m_trackEntries == NULL);
  assert(m_trackEntriesEnd == NULL);

  const long long stop = m_start + m_size;
  IMkvReader* const pReader = m_pSegment->m_pReader;

  int count = 0;
  long long pos = m_start;

  while (pos < stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (size == 0)  // weird
      continue;

    if (id == libwebm::kMkvTrackEntry)
      ++count;

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  if (count <= 0)
    return 0;  // success

  m_trackEntries = new (std::nothrow) Track*[count];

  if (m_trackEntries == NULL)
    return -1;

  m_trackEntriesEnd = m_trackEntries;

  pos = m_start;

  while (pos < stop) {
    const long long element_start = pos;

    long long id, payload_size;

    const long status =
        ParseElementHeader(pReader, pos, stop, id, payload_size);

    if (status < 0)  // error
      return status;

    if (payload_size == 0)  // weird
      continue;

    const long long payload_stop = pos + payload_size;
    assert(payload_stop <= stop);  // checked in ParseElement

    const long long element_size = payload_stop - element_start;

    if (id == libwebm::kMkvTrackEntry) {
      Track*& pTrack = *m_trackEntriesEnd;
      pTrack = NULL;

      const long status = ParseTrackEntry(pos, payload_size, element_start,
                                          element_size, pTrack);
      if (status)
        return status;

      if (pTrack)
        ++m_trackEntriesEnd;
    }

    pos = payload_stop;
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  return 0;  // success
}